

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

QStringList * __thiscall QUrlModel::mimeTypes(QStringList *__return_storage_ptr__,QUrlModel *this)

{
  long in_FS_OFFSET;
  QLatin1String local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.m_size = QtPrivate::lengthHelperPointer<char>("text/uri-list");
  local_28.m_data = "text/uri-list";
  QList<QString>::QList<QLatin1String,void>(__return_storage_ptr__,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QUrlModel::mimeTypes() const
{
    return QStringList(QLatin1StringView(uriListMimeType));
}